

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::Save(CaptureSummary *this,char *file_name)

{
  value_type p_Var1;
  FILE *__stream;
  char *pcVar2;
  CaptureLine *pCVar3;
  reference pp_Var4;
  bool bVar5;
  bool bVar6;
  CaptureLine *line;
  size_t i;
  bool ret;
  FILE *F;
  char *file_name_local;
  CaptureSummary *this_local;
  
  __stream = (FILE *)ithi_file_open(file_name,"w");
  bVar6 = __stream != (FILE *)0x0;
  if (bVar6) {
    pcVar2 = DnsStats::GetTableName(0);
    fprintf(__stream,"\"%s\",0,0,%d,\n",pcVar2,(ulong)(uint)this->capture_version);
  }
  line = (CaptureLine *)0x0;
  while( true ) {
    bVar5 = false;
    if (bVar6) {
      pCVar3 = (CaptureLine *)
               std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size(&this->summary);
      bVar5 = line < pCVar3;
    }
    if (!bVar5) break;
    pp_Var4 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                        (&this->summary,(size_type)line);
    p_Var1 = *pp_Var4;
    fprintf(__stream,"%s,%d,",p_Var1,(ulong)(uint)p_Var1->key_type);
    if (p_Var1->key_type == 0) {
      fprintf(__stream,"%d,",(ulong)(uint)(p_Var1->field_2).key_number);
    }
    else {
      fprintf(__stream,"%s,",&p_Var1->field_2);
    }
    fprintf(__stream,"%lld,\n",p_Var1->count);
    line = (CaptureLine *)(line->registry_name + 1);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar6;
}

Assistant:

bool CaptureSummary::Save(char const * file_name)
{
    FILE* F = ithi_file_open(file_name, "w");
    bool ret = (F != NULL);

    if (ret) {
        /* TODO: write the version number */
        fprintf(F, "\"%s\",0,0,%d,\n", DnsStats::GetTableName(REGISTRY_ITHITOOLS_VERSION), capture_version);
    }

    for (size_t i = 0; ret && i < summary.size(); i++)
    {
        CaptureLine * line = summary[i];

        // Print current line
        fprintf(F, """%s"",%d,", line->registry_name, line->key_type);

        if (line->key_type == 0)
        {
            fprintf(F, "%d,", line->key_number);
        }
        else
        {
            fprintf(F, """%s"",", line->key_value);
        }

        fprintf(F, """%lld"",\n", (long long)line->count);
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}